

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

LoadedFile * lf_load_keyfile_fp(FILE *fp,char **errptr)

{
  _Bool _Var1;
  LoadFileStatus status;
  LoadedFile *lf;
  
  lf = lf_new(0x56555);
  status = lf_load_fp(lf,fp);
  _Var1 = lf_load_keyfile_helper(status,errptr);
  if (!_Var1) {
    lf_free(lf);
    lf = (LoadedFile *)0x0;
  }
  return lf;
}

Assistant:

LoadedFile *lf_load_keyfile_fp(FILE *fp, const char **errptr)
{
    LoadedFile *lf = lf_new(MAX_KEY_FILE_SIZE);
    if (!lf_load_keyfile_helper(lf_load_fp(lf, fp), errptr)) {
        lf_free(lf);
        return NULL;
    }
    return lf;
}